

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

void __thiscall
vkt::wsi::anon_unknown_0::NativeObjects::NativeObjects
          (NativeObjects *this,Context *context,Extensions *supportedExtensions,Type wsiType,
          Maybe<tcu::Vector<unsigned_int,_2>_> *initialWindowSize)

{
  int iVar1;
  undefined4 extraout_var;
  Display *pDVar2;
  undefined4 extraout_var_00;
  UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> local_a0 [2];
  UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> local_80 [6];
  
  iVar1 = (*context->m_testCtx->m_platform->_vptr_Platform[5])();
  pDVar2 = (Display *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 8))
                     ((long *)CONCAT44(extraout_var,iVar1),wsiType);
  local_80[0].m_data.ptr = (Display *)0x0;
  (this->display).super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.
  ptr = pDVar2;
  de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::~UniqueBase
            (local_80);
  pDVar2 = (this->display).super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
           .m_data.ptr;
  iVar1 = (*pDVar2->_vptr_Display[2])(pDVar2,initialWindowSize);
  local_a0[0].m_data.ptr = (Window *)0x0;
  (this->window).super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr
       = (Window *)CONCAT44(extraout_var_00,iVar1);
  de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::~UniqueBase
            (local_a0);
  return;
}

Assistant:

NativeObjects (Context&				context,
				   const Extensions&	supportedExtensions,
				   Type					wsiType,
				   const Maybe<UVec2>&	initialWindowSize = tcu::nothing<UVec2>())
		: display	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(), supportedExtensions, wsiType))
		, window	(createWindow(*display, initialWindowSize))
	{}